

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void train(Ptr<cv::face::FacemarkLBF> *facemark)

{
  long lVar1;
  element_type *peVar2;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images_train;
  String ptsFiles;
  String imageFiles;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> facial_points;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  landmarks_train;
  Mat image;
  allocator local_209;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  Ptr<cv::face::FacemarkLBF> *local_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  void **local_1e0;
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  long *local_168 [2];
  long local_158 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  undefined1 local_f0 [16];
  uchar *puStack_e0;
  Mat local_90;
  
  local_1a8 = local_198;
  local_1f0 = facemark;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"../dlib_faces_5points/images_train.txt","");
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"../dlib_faces_5points/points_train.txt","");
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,local_1a8,local_1a0 + (long)local_1a8);
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,local_1c8,local_1c0 + (long)local_1c8);
  cv::face::loadDatasetList(local_110,local_130,&local_208,&local_148);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  cv::Mat::Mat(&local_90);
  local_188 = (void *)0x0;
  uStack_180 = 0;
  local_178 = 0;
  if (local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_1e8,
                 *(char **)((long)&((local_208.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar4),&local_209);
      cv::imread((string *)local_f0,(int)(string *)&local_1e8);
      cv::Mat::operator=(&local_90,(Mat *)local_f0);
      cv::Mat::~Mat((Mat *)local_f0);
      if ((long *)CONCAT44(uStack_1e4,local_1e8) != local_1d8) {
        operator_delete((long *)CONCAT44(uStack_1e4,local_1e8),local_1d8[0] + 1);
      }
      local_168[0] = local_158;
      lVar1 = *(long *)((long)&((local_148.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,lVar1,
                 *(long *)((long)&(local_148.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                          lVar4) + lVar1);
      puStack_e0 = (uchar *)0x0;
      local_f0._0_4_ = -0x7dfcfff3;
      local_f0._8_8_ = &local_188;
      cv::face::loadFacePoints(0,(string *)local_168,(Mat *)local_f0);
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      peVar2 = (local_1f0->super_shared_ptr<cv::face::FacemarkLBF>).
               super___shared_ptr<cv::face::FacemarkLBF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puStack_e0 = (uchar *)0x0;
      local_f0._0_4_ = 0x1010000;
      local_f0._8_8_ = &local_90;
      local_1d8[0] = 0;
      local_1e8 = 0x8103000d;
      local_1e0 = &local_188;
      (**(code **)(*(long *)peVar2 + 0x50))(peVar2,(Mat *)local_f0,(string *)&local_1e8);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < (ulong)((long)local_208.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_208.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  peVar2 = (local_1f0->super_shared_ptr<cv::face::FacemarkLBF>).
           super___shared_ptr<cv::face::FacemarkLBF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)peVar2 + 0x58))(peVar2,0);
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,local_178 - (long)local_188);
  }
  cv::Mat::~Mat(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  return;
}

Assistant:

void train(Ptr<FacemarkLBF> facemark)
{
    // load the dataset list
    String imageFiles = "../dlib_faces_5points/images_train.txt";
    String ptsFiles = "../dlib_faces_5points/points_train.txt";
    vector<String> images_train;
    vector<String> landmarks_train;
    loadDatasetList(imageFiles,ptsFiles,images_train,landmarks_train);

    // add the training samples to the trainer
    Mat image;
    vector<Point2f> facial_points;
    for(size_t i=0;i<images_train.size();i++){
        image = imread(images_train[i].c_str());
        loadFacePoints(landmarks_train[i],facial_points);
        facemark->addTrainingSample(image, facial_points);
    }

    // training process
    facemark->training();
}